

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_consecrate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  short sVar2;
  ROOM_INDEX_DATA *pRVar3;
  ROOM_INDEX_DATA *pRVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *txt;
  long lVar8;
  ROOM_AFFECT_DATA local_e0;
  AFFECT_DATA af;
  
  bVar5 = is_affected(ch,sn);
  if (bVar5) {
    txt = "You do not feel up to purging a room of evil yet.\n\r";
  }
  else {
    pRVar3 = ch->in_room;
    if ((pRVar3->vnum == 0x4bc) || ((pRVar3->room_flags[0] & 0x8000010) != 0)) {
      txt = "Spell failed.\n\r";
    }
    else {
      bVar5 = is_affected_room(pRVar3,(int)gsn_consecrate);
      if (bVar5) {
        txt = "This room is already consecrated.\n\r";
      }
      else {
        pRVar3 = ch->in_room;
        if ((pRVar3->room_flags[0] & 0x2000) == 0) {
          txt = "This room is not in need of holy blessing.\n\r";
        }
        else {
          sVar1 = ch->level;
          sVar2 = ch->pcdata->learned[sn];
          iVar7 = 0;
          for (lVar8 = 7; lVar8 != 0xd; lVar8 = lVar8 + 1) {
            if ((pRVar3->exit[lVar8 + -7] != (EXIT_DATA *)0x0) &&
               (pRVar4 = (pRVar3->exit[lVar8 + -7]->u1).to_room,
               pRVar4 != pRVar3 && pRVar4 != (ROOM_INDEX_DATA *)0x0)) {
              iVar7 = iVar7 + (uint)(((uint)pRVar4->room_flags[0] >> 0xd & 1) != 0);
            }
          }
          act("$n gestures around the room and utters a blessing of holy rights.",ch,(void *)0x0,
              (void *)0x0,0);
          send_to_char("You chant a blessing and give the divine somatic motions of consecration.\n\r"
                       ,ch);
          iVar6 = number_percent();
          if (iVar6 <= iVar7 * -10 + (int)(sVar2 / 2) + (int)sVar1) {
            act("The atmosphere in the room lightens.",ch,(void *)0x0,(void *)0x0,0);
            send_to_char("You succeed in consecrating the ground for a brief period!\n\r",ch);
            init_affect_room(&local_e0);
            local_e0.where = 0;
            local_e0.type = (short)sn;
            local_e0.level = (short)level;
            local_e0.aftype = 4;
            iVar7 = number_range(4,6);
            local_e0.duration = (short)iVar7;
            local_e0.location = 0;
            local_e0.modifier = 0;
            local_e0.tick_fun = (RAFF_FUN *)0x0;
            local_e0.end_fun = (RAFF_FUN *)0x0;
            local_e0.owner = ch;
            new_affect_to_room(ch->in_room,&local_e0);
            init_affect(&af);
            af.where = 0;
            af.modifier = 0;
            af.duration = 0xf;
            af.location = 0;
            af.type = (short)sn;
            af.level = (short)level;
            af.aftype = 4;
            affect_to_char(ch,&af);
            return;
          }
          act("You feel the atmosphere lighten for a moment but it passes.",ch,(void *)0x0,
              (void *)0x0,0);
          txt = "Your holy rights are invoked but fail to affect the room\'s evil.\n\r";
        }
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_consecrate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	ROOM_INDEX_DATA *in_room;
	ROOM_INDEX_DATA *room_check;
	int count, door;
	EXIT_DATA *pexit;
	ROOM_AFFECT_DATA raf;
	AFFECT_DATA af;
	int chance;

	if (is_affected(ch, sn))
	{
		send_to_char("You do not feel up to purging a room of evil yet.\n\r", ch);
		return;
	}

	if (ch->in_room->vnum == 1212
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_CONSECRATE)
		|| IS_SET(ch->in_room->room_flags, ROOM_FORCE_DUEL))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_consecrate))
	{
		send_to_char("This room is already consecrated.\n\r", ch);
		return;
	}

	if (!IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL))
	{
		send_to_char("This room is not in need of holy blessing.\n\r", ch);
		return;
	}

	chance = ch->level + (ch->pcdata->learned[sn] / 2);

	in_room = ch->in_room;
	count = 0;

	for (door = 0; door < 6; door++)
	{
		if ((pexit = in_room->exit[door]) == nullptr || (room_check = pexit->u1.to_room) == nullptr)
			continue;

		if (room_check == in_room)
			continue;

		if (IS_SET(room_check->room_flags, ROOM_NO_RECALL))
			count++;
	}

	chance -= count * 10;

	act("$n gestures around the room and utters a blessing of holy rights.", ch, 0, 0, TO_ROOM);
	send_to_char("You chant a blessing and give the divine somatic motions of consecration.\n\r", ch);

	if (number_percent() > chance)
	{
		act("You feel the atmosphere lighten for a moment but it passes.", ch, 0, 0, TO_ROOM);
		send_to_char("Your holy rights are invoked but fail to affect the room's evil.\n\r", ch);
		return;
	}

	act("The atmosphere in the room lightens.", ch, 0, 0, TO_ROOM);
	send_to_char("You succeed in consecrating the ground for a brief period!\n\r", ch);

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.aftype = AFT_COMMUNE;
	raf.type = sn;
	raf.level = level;
	raf.duration = number_range(4, 6);
	raf.location = APPLY_NONE;
	raf.modifier = 0;
	raf.owner = ch;
	raf.end_fun = nullptr;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.location = 0;
	af.modifier = 0;
	af.level = level;
	af.duration = 15;
	affect_to_char(ch, &af);
}